

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void GetShellEscapedString(string *input,string *result)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  size_type sVar3;
  char kEscapeSequence [4];
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util.cc",
                  0x115,"void GetShellEscapedString(const string &, string *)");
  }
  uVar2 = 0;
  do {
    if (input->_M_string_length == uVar2) {
LAB_0011cd1d:
      std::__cxx11::string::append((string *)result);
      return;
    }
    bVar1 = (input->_M_dataplus)._M_p[uVar2];
    if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
       ((0x34 < bVar1 - 0x2b || ((0x1000000000001dU >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0))))
    {
      if (uVar2 < input->_M_string_length) {
        std::__cxx11::string::push_back((char)result);
        __first._M_current = (input->_M_dataplus)._M_p;
        __last._M_current = __first._M_current;
        for (sVar3 = input->_M_string_length; sVar3 != 0; sVar3 = sVar3 - 1) {
          if (*__last._M_current == '\'') {
            std::__cxx11::string::
            append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((string *)result,__first,__last);
            std::__cxx11::string::append((char *)result);
            __first._M_current = __last._M_current;
          }
          __last._M_current = __last._M_current + 1;
        }
        std::__cxx11::string::
        append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)result,__first,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )((input->_M_dataplus)._M_p + input->_M_string_length));
        std::__cxx11::string::push_back((char)result);
        return;
      }
      goto LAB_0011cd1d;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void GetShellEscapedString(const string& input, string* result) {
  assert(result);

  if (!StringNeedsShellEscaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '\'';
  const char kEscapeSequence[] = "'\\'";

  result->push_back(kQuote);

  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    if (*it == kQuote) {
      result->append(span_begin, it);
      result->append(kEscapeSequence);
      span_begin = it;
    }
  }
  result->append(span_begin, input.end());
  result->push_back(kQuote);
}